

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O1

size_t fio_str_utf8_valid(fio_str_s *s)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  byte bVar4;
  ulong uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint uVar8;
  uint uVar9;
  
  if (s == (fio_str_s *)0x0) {
    return 0;
  }
  if ((s->small == 0) && (puVar7 = (uint8_t *)s->data, puVar7 != (uint8_t *)0x0)) {
    uVar5 = s->len;
  }
  else {
    uVar5 = (ulong)(s->small >> 1);
    puVar7 = s->reserved;
  }
  if (uVar5 == 0) {
    return 1;
  }
  puVar6 = puVar7 + uVar5;
  do {
    bVar4 = *puVar7;
    uVar9 = (uint)bVar4;
    uVar8 = 0xffffffff;
    switch("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x05\x05\x05\x05\x05\x05\x05\x05\x02\x02\x02\x02\x03\x03\x04"
           [bVar4 >> 3]) {
    case '\x01':
      puVar7 = puVar7 + 1;
      uVar8 = uVar9;
      break;
    case '\x02':
      if ((puVar7 + 2 <= puVar6) && (puVar1 = puVar7 + 1, (*puVar1 & 0xffffffc0) == 0x80)) {
        puVar7 = puVar7 + 2;
        uVar8 = *puVar1 & 0x3f | (uVar9 & 0x1f) << 6;
      }
      break;
    case '\x03':
      if (((puVar7 + 3 <= puVar6) && (puVar1 = puVar7 + 1, (*puVar1 & 0xffffffc0) == 0x80)) &&
         (puVar2 = puVar7 + 2, (*puVar2 & 0xc0) == 0x80)) {
        puVar7 = puVar7 + 3;
        uVar8 = *puVar2 & 0x3f | (*puVar1 & 0x3f) << 6 | (uVar9 & 0xf) << 0xc;
      }
      break;
    case '\x04':
      if ((((puVar7 + 4 <= puVar6) && (puVar1 = puVar7 + 1, (*puVar1 & 0xffffffc0) == 0x80)) &&
          (puVar2 = puVar7 + 2, (*puVar2 & 0xc0) == 0x80)) &&
         (puVar3 = puVar7 + 3, (*puVar3 & 0xffffffc0) == 0x80)) {
        puVar7 = puVar7 + 4;
        uVar8 = *puVar3 & 0x3f |
                (*puVar2 & 0x3f) << 6 | (*puVar1 & 0x3f) << 0xc | (bVar4 & 7) << 0x12;
      }
    }
  } while ((0 < (int)uVar8) && (puVar7 < puVar6));
  return (ulong)(-1 < (int)uVar8 && puVar7 == puVar6);
}

Assistant:

FIO_FUNC size_t fio_str_utf8_valid(fio_str_s *s) {
  if (!s)
    return 0;
  fio_str_info_s state = fio_str_info(s);
  if (!state.len)
    return 1;
  char *const end = state.data + state.len;
  int32_t c = 0;
  do {
    FIO_STR_UTF8_CODE_POINT(state.data, end, c);
  } while (c > 0 && state.data < end);
  return state.data == end && c >= 0;
}